

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O0

void dic_resize(dictionary *dic,int newsize)

{
  int iVar1;
  keynode **__ptr;
  keynode *pkVar2;
  keynode **ppkVar3;
  keynode *next;
  keynode *k;
  int i;
  keynode **old;
  int o;
  int newsize_local;
  dictionary *dic_local;
  
  iVar1 = dic->length;
  __ptr = dic->table;
  ppkVar3 = (keynode **)calloc(8,(long)newsize);
  dic->table = ppkVar3;
  dic->length = newsize;
  for (k._4_4_ = 0; k._4_4_ < iVar1; k._4_4_ = k._4_4_ + 1) {
    next = __ptr[k._4_4_];
    while (next != (keynode *)0x0) {
      pkVar2 = next->next;
      next->next = (keynode *)0x0;
      dic_reinsert_when_resizing(dic,next);
      next = pkVar2;
    }
  }
  free(__ptr);
  return;
}

Assistant:

void dic_resize(struct dictionary* dic, int newsize) {
	int o = dic->length;
	struct keynode **old = dic->table;
	dic->table = calloc(sizeof(struct keynode*), newsize);
	dic->length = newsize;
	for (int i = 0; i < o; i++) {
		struct keynode *k = old[i];
		while (k) {
			struct keynode *next = k->next;
			k->next = 0;
			dic_reinsert_when_resizing(dic, k);
			k = next;
		}
	}
	free(old);
}